

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_23::TapAssertionPrinter::printReconstructedExpression(TapAssertionPrinter *this)

{
  bool bVar1;
  Code _colourCode;
  char local_5a [2];
  char *local_58;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  undefined1 local_48 [8];
  string expr;
  Colour local_11;
  TapAssertionPrinter *pTStack_10;
  Colour colour;
  TapAssertionPrinter *this_local;
  
  pTStack_10 = this;
  bVar1 = AssertionResult::hasExpandedExpression(this->result);
  if (bVar1) {
    _colourCode = dimColour();
    Colour::Colour(&local_11,_colourCode);
    std::operator<<(this->stream," for: ");
    Colour::~Colour(&local_11);
    AssertionResult::getExpandedExpression_abi_cxx11_((string *)local_48,this->result);
    local_50._M_current =
         (char *)std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 begin((string *)local_48);
    local_58 = (char *)std::__cxx11::
                       basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                                 ((string *)local_48);
    local_5a[1] = 10;
    local_5a[0] = ' ';
    std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
              (local_50,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         )local_58,local_5a + 1,local_5a);
    std::operator<<(this->stream,(string *)local_48);
    std::__cxx11::string::~string((string *)local_48);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
                if (result.hasExpandedExpression()) {
                    {
                        Colour colour(dimColour());
                        stream << " for: ";
                    }
                    std::string expr = result.getExpandedExpression();
                    std::replace(expr.begin(), expr.end(), '\n', ' ');
                    stream << expr;
                }
            }